

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1450.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  istream *piVar3;
  reference pvVar4;
  reference pvVar5;
  int local_70;
  int local_6c;
  int j;
  int i_1;
  int f;
  int s;
  int local_58;
  int local_54;
  int local_50;
  int w;
  int b;
  int a;
  int i;
  allocator<int> local_35;
  value_type_conflict local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> res;
  int local_10;
  int m;
  int n;
  
  m = 0;
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (piVar3,(int *)((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 4));
  local_34 = -1;
  std::allocator<int>::allocator(&local_35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,0x1fe,&local_34,&local_35);
  std::allocator<int>::~allocator(&local_35);
  for (b = 0; b < res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage._4_4_; b = b + 1) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&w);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_50);
    std::istream::operator>>(piVar3,&local_54);
    f = w + -1;
    s = local_50 + -1;
    local_58 = local_54;
    std::vector<e,_std::allocator<e>_>::push_back(&v,(value_type *)&f);
  }
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&i_1);
  std::istream::operator>>(piVar3,&j);
  i_1 = i_1 + -1;
  j = j + -1;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,(long)i_1);
  *pvVar4 = 0;
  for (local_6c = 0; local_6c < local_10 + -1; local_6c = local_6c + 1) {
    for (local_70 = 0;
        local_70 <
        res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_70 = local_70 + 1) {
      pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,(long)pvVar5->a);
      if (*pvVar4 != -1) {
        pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,(long)pvVar5->b);
        iVar1 = *pvVar4;
        pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,(long)pvVar5->a);
        iVar2 = *pvVar4;
        pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
        if (iVar1 < iVar2 + pvVar5->w) {
          pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_30,(long)pvVar5->a);
          iVar1 = *pvVar4;
          pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
          iVar2 = pvVar5->w;
          pvVar5 = std::vector<e,_std::allocator<e>_>::operator[](&v,(long)local_70);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_30,(long)pvVar5->b);
          *pvVar4 = iVar1 + iVar2;
        }
      }
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,(long)j);
  if (*pvVar4 == -1) {
    std::operator<<((ostream *)&std::cout,"No solution");
  }
  else {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)j);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
  }
  m = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return m;
}

Assistant:

int main() {
    int n, m;
    std::cin >> n >> m;
    std::vector<int> res(510, -1);
    for (int i = 0; i < m; ++i) {
        int a, b, w;
        std::cin >> a >> b >> w;
        v.push_back({a - 1, b - 1, w});
    }
    int s, f;
    std::cin >> s >> f;
    s--;
    f--;
    res[s] = 0;

    for (int i = 0; i < n - 1; ++i) {
        for (int j = 0; j < m; ++j) {
            if (res[v[j].a] != -1 && res[v[j].b] < res[v[j].a] + v[j].w) {
                res[v[j].b] = res[v[j].a] + v[j].w;
            }
        }
    }
    if (res[f] != -1) {
        std::cout << res[f];
    } else {
        std::cout << "No solution";
    }

    return 0;
}